

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O3

int coda_get_params_buf(coda_params_t *params,char *s,size_t len)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  string key;
  key_type local_50;
  
  if (s == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    if (0 < (long)len) {
      pcVar5 = s + len;
      do {
        pcVar2 = coda_strnchr(s,'&',(long)pcVar5 - (long)s);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = pcVar5;
        }
        pcVar3 = coda_strnchr(s,'=',(long)pcVar5 - (long)s);
        if (pcVar3 < pcVar2 && pcVar3 != (char *)0x0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,s,pcVar3);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](params,&local_50);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)(pcVar3 + 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        s = pcVar2 + 1;
      } while (s < pcVar5);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int coda_get_params_buf(coda_params_t& params, const char* s, size_t len)
{
	if (!s) return -1;

	const char* e = s + len;

	while (s < e)
	{
		const char* amp = coda_strnchr(s, '&', e - s);
		if (NULL == amp) amp = e;

		const char* equ = coda_strnchr(s, '=', e - s);
		if (NULL != equ && equ < amp)
		{
			std::string key (s, equ - s);
			params[key].assign(equ + 1, amp - equ - 1);
		}

		s = amp + 1;
	}

	return 0;
}